

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SphereTriangleDetector.cpp
# Opt level: O2

cbtScalar SegmentSqrDistance(cbtVector3 *from,cbtVector3 *to,cbtVector3 *p,cbtVector3 *nearest)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar11 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar16 [56];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  float fVar17;
  undefined1 auVar18 [16];
  float fVar19;
  cbtVector3 cVar20;
  cbtVector3 cVar21;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  cbtVector3 local_28;
  undefined1 auVar12 [56];
  
  auVar16 = in_ZMM1._8_56_;
  auVar11 = in_ZMM0._8_56_;
  cVar20 = operator-(p,from);
  auVar13._0_8_ = cVar20.m_floats._8_8_;
  auVar13._8_56_ = auVar16;
  auVar8._0_8_ = cVar20.m_floats._0_8_;
  auVar8._8_56_ = auVar11;
  local_48 = auVar8._0_16_;
  local_38 = auVar13._0_16_;
  auVar12 = auVar11;
  cVar21 = operator-(to,from);
  auVar14._0_8_ = cVar21.m_floats._8_8_;
  auVar14._8_56_ = auVar16;
  auVar9._0_8_ = cVar21.m_floats._0_8_;
  auVar9._8_56_ = auVar12;
  auVar5 = auVar9._0_16_;
  fVar1 = cVar21.m_floats[0];
  auVar18._0_4_ = cVar20.m_floats[0] * fVar1;
  fVar2 = cVar21.m_floats[1];
  auVar18._4_4_ = cVar20.m_floats[1] * fVar2;
  fVar3 = auVar12._0_4_;
  auVar18._8_4_ = auVar11._0_4_ * fVar3;
  fVar4 = auVar12._4_4_;
  auVar18._12_4_ = auVar11._4_4_ * fVar4;
  auVar18 = vmovshdup_avx(auVar18);
  fVar17 = 0.0;
  auVar18 = vfmadd231ss_fma(auVar18,auVar5,local_48);
  auVar6 = auVar14._0_16_;
  auVar18 = vfmadd231ss_fma(auVar18,auVar6,local_38);
  fVar19 = auVar18._0_4_;
  if (0.0 < fVar19) {
    auVar18 = vmovshdup_avx(auVar5);
    auVar18 = vfmadd231ss_fma(ZEXT416((uint)(auVar18._0_4_ * auVar18._0_4_)),auVar5,auVar5);
    auVar18 = vfmadd231ss_fma(auVar18,auVar6,auVar6);
    if (auVar18._0_4_ <= fVar19) {
      auVar18 = vsubps_avx(local_38,auVar6);
      local_48 = vsubps_avx(local_48,auVar5);
      local_38 = vblendps_avx(auVar18,local_38,2);
      fVar17 = 1.0;
    }
    else {
      fVar17 = fVar19 / auVar18._0_4_;
      auVar5._0_4_ = fVar1 * fVar17;
      auVar5._4_4_ = fVar2 * fVar17;
      auVar5._8_4_ = fVar3 * fVar17;
      auVar5._12_4_ = fVar4 * fVar17;
      local_48 = vsubps_avx(local_48,auVar5);
      local_38._4_12_ = auVar13._4_12_;
      local_38._0_4_ = cVar20.m_floats[2] - cVar21.m_floats[2] * fVar17;
    }
  }
  auVar11 = (undefined1  [56])0x0;
  auVar6._0_4_ = fVar1 * fVar17;
  auVar6._4_4_ = fVar2 * fVar17;
  auVar6._8_4_ = fVar3 * fVar17;
  auVar6._12_4_ = fVar4 * fVar17;
  local_28.m_floats =
       (cbtScalar  [4])vinsertps_avx(auVar6,ZEXT416((uint)(cVar21.m_floats[2] * fVar17)),0x28);
  auVar12 = ZEXT856(local_28.m_floats._8_8_);
  cVar20 = operator+(from,&local_28);
  auVar15._0_8_ = cVar20.m_floats._8_8_;
  auVar15._8_56_ = auVar11;
  auVar10._0_8_ = cVar20.m_floats._0_8_;
  auVar10._8_56_ = auVar12;
  auVar18 = vmovlhps_avx(auVar10._0_16_,auVar15._0_16_);
  *(undefined1 (*) [16])nearest->m_floats = auVar18;
  auVar7._0_4_ = local_48._0_4_ * local_48._0_4_;
  auVar7._4_4_ = local_48._4_4_ * local_48._4_4_;
  auVar7._8_4_ = local_48._8_4_ * local_48._8_4_;
  auVar7._12_4_ = local_48._12_4_ * local_48._12_4_;
  auVar18 = vmovshdup_avx(auVar7);
  auVar18 = vfmadd231ss_fma(auVar18,local_48,local_48);
  auVar18 = vfmadd231ss_fma(auVar18,local_38,local_38);
  return auVar18._0_4_;
}

Assistant:

cbtScalar SegmentSqrDistance(const cbtVector3& from, const cbtVector3& to, const cbtVector3& p, cbtVector3& nearest)
{
	cbtVector3 diff = p - from;
	cbtVector3 v = to - from;
	cbtScalar t = v.dot(diff);

	if (t > 0)
	{
		cbtScalar dotVV = v.dot(v);
		if (t < dotVV)
		{
			t /= dotVV;
			diff -= t * v;
		}
		else
		{
			t = 1;
			diff -= v;
		}
	}
	else
		t = 0;

	nearest = from + t * v;
	return diff.dot(diff);
}